

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_io.h
# Opt level: O2

size_t __thiscall
dmlc::MemoryFixedSizeStream::Read(MemoryFixedSizeStream *this,void *ptr,size_t size)

{
  ostream *poVar1;
  size_t sVar2;
  ulong uVar3;
  ulong __n;
  LogMessageFatal LStack_1a8;
  
  uVar3 = this->buffer_size_;
  sVar2 = this->curr_ptr_;
  if (uVar3 < sVar2 + size) {
    LogMessageFatal::LogMessageFatal
              (&LStack_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/memory_io.h"
               ,0x22);
    poVar1 = std::operator<<((ostream *)&LStack_1a8,"Check failed: curr_ptr_ + size <= buffer_size_"
                            );
    std::operator<<(poVar1,": ");
    LogMessageFatal::~LogMessageFatal(&LStack_1a8);
    uVar3 = this->buffer_size_;
    sVar2 = this->curr_ptr_;
  }
  __n = uVar3 - sVar2;
  if (size <= uVar3 - sVar2) {
    __n = size;
  }
  if (__n != 0) {
    memcpy(ptr,this->p_buffer_ + sVar2,__n);
    sVar2 = this->curr_ptr_;
  }
  this->curr_ptr_ = sVar2 + __n;
  return __n;
}

Assistant:

virtual size_t Read(void *ptr, size_t size) {
    CHECK(curr_ptr_ + size <= buffer_size_);
    size_t nread = std::min(buffer_size_ - curr_ptr_, size);
    if (nread != 0)
      std::memcpy(ptr, p_buffer_ + curr_ptr_, nread);
    curr_ptr_ += nread;
    return nread;
  }